

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assignment.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  size_t i_1;
  PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8> *this;
  Cascade *this_00;
  size_t i;
  long lVar4;
  double se;
  FilterType filter2;
  FilterType filter;
  Storage SStack_748;
  PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8> *pPStack_738;
  array<double,_5UL> local_718;
  Cascade local_6f0 [2];
  PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8> local_6c8;
  PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8> local_370;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Creating and testing filter using automatic decl\n",0x31);
  this = &local_370;
  Iir::PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8>::PoleFilter(this);
  Iir::Butterworth::HighPassBase::setup(&this->super_HighPassBase,8,0.1);
  testFilter(&local_718,(FilterType *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Creating and testing filter using object assignment\n",0x34);
  lVar4 = 0;
  memset(&local_6c8,0,0x358);
  Iir::PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8>::PoleFilter(&local_6c8);
  local_370.super_CascadeStages<4,_Iir::DirectFormII>.m_states[3].m_v1 = 0.0;
  local_370.super_CascadeStages<4,_Iir::DirectFormII>.m_states[3].m_v2 = 0.0;
  local_370.super_CascadeStages<4,_Iir::DirectFormII>.m_states[2].m_v1 = 0.0;
  local_370.super_CascadeStages<4,_Iir::DirectFormII>.m_states[2].m_v2 = 0.0;
  local_370.super_CascadeStages<4,_Iir::DirectFormII>.m_states[1].m_v1 = 0.0;
  local_370.super_CascadeStages<4,_Iir::DirectFormII>.m_states[1].m_v2 = 0.0;
  local_370.super_CascadeStages<4,_Iir::DirectFormII>.m_states[0].m_v1 = 0.0;
  local_370.super_CascadeStages<4,_Iir::DirectFormII>.m_states[0].m_v2 = 0.0;
  Iir::Butterworth::HighPassBase::setup(&this->super_HighPassBase,8,0.1);
  this_00 = local_6f0;
  testFilter((array<double,_5UL> *)this_00,(FilterType *)this);
  dVar2 = 0.0;
  do {
    dVar3 = local_718._M_elems[lVar4] - *(double *)(&local_6f0[0].m_numStages + lVar4 * 2);
    dVar2 = dVar2 + dVar3 * dVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  if (1e-10 <= dVar2) {
    main_cold_4();
LAB_001027d9:
    main_cold_3();
  }
  else {
    this = &local_6c8;
    memcpy(this,&local_370,0x358);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Calculating continued response using original filter:\n",0x36)
    ;
    testFilter(&local_718,(FilterType *)&local_370);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Calculating continued response using assigned filter:\n",0x36)
    ;
    this_00 = local_6f0;
    testFilter((array<double,_5UL> *)this_00,(FilterType *)this);
    dVar2 = 0.0;
    lVar4 = 0;
    do {
      dVar3 = *(double *)((long)local_718._M_elems + lVar4) -
              *(double *)((long)&DAT_00106248 + lVar4);
      dVar2 = dVar2 + dVar3 * dVar3;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x28);
    if (1e-10 <= dVar2) goto LAB_001027d9;
    dVar2 = 0.0;
    lVar4 = 0;
    do {
      dVar3 = local_718._M_elems[lVar4] - *(double *)(&local_6f0[0].m_numStages + lVar4 * 2);
      dVar2 = dVar2 + dVar3 * dVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    if (dVar2 < 1e-10) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Checking continued responses differ when second filter changes cutoff:\n",0x47);
      this = &local_6c8;
      Iir::Butterworth::HighPassBase::setup(&this->super_HighPassBase,8,0.3);
      testFilter(&local_718,(FilterType *)&local_370);
      this_00 = local_6f0;
      testFilter((array<double,_5UL> *)this_00,(FilterType *)this);
      dVar2 = 0.0;
      lVar4 = 0;
      do {
        dVar3 = local_718._M_elems[lVar4] - *(double *)(&local_6f0[0].m_numStages + lVar4 * 2);
        dVar2 = dVar2 + dVar3 * dVar3;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 5);
      if (0.001 < dVar2) {
        return 0;
      }
      goto LAB_001027e3;
    }
  }
  main_cold_2();
LAB_001027e3:
  main_cold_1();
  this_00[1].m_numStages = 0;
  this_00[1].m_maxStages = 0;
  this_00[1].m_stageArray = (Biquad *)0x0;
  this_00->m_numStages = 0;
  this_00->m_maxStages = 0;
  this_00->m_stageArray = (Biquad *)0x0;
  this_00[2].m_numStages = 0;
  this_00[2].m_maxStages = 0;
  this_00[2].m_stageArray = (Biquad *)0x3ff0000000000000;
  pPStack_738 = this;
  Iir::Butterworth::AnalogLowPass::AnalogLowPass((AnalogLowPass *)(this_00 + 3));
  lVar4 = 0x80;
  do {
    *(undefined8 *)((long)this_00 + lVar4 + -0x28) = 0x3ff0000000000000;
    puVar1 = (undefined8 *)((long)&this_00[-2].m_numStages + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&this_00[-1].m_numStages + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&this_00->m_numStages + lVar4) = 0x3ff0000000000000;
    lVar4 = lVar4 + 0x30;
  } while (lVar4 != 0x140);
  memset(&this_00[0x11].m_stageArray,0,0x240);
  SStack_748.maxStages = 4;
  SStack_748.stageArray = (Biquad *)&this_00[5].m_stageArray;
  Iir::Cascade::setCascadeStorage(this_00,&SStack_748);
  this_00[3].m_numStages = 0;
  this_00[3].m_maxStages = 8;
  this_00[3].m_stageArray = (Biquad *)&this_00[0x15].m_stageArray;
  this_00[1].m_numStages = 0;
  this_00[1].m_maxStages = 8;
  this_00[1].m_stageArray = (Biquad *)&this_00[0x25].m_stageArray;
  this_00[2].m_numStages = 0;
  this_00[2].m_maxStages = 0;
  *(undefined4 *)&this_00[2].m_stageArray = 0;
  *(undefined4 *)((long)&this_00[2].m_stageArray + 4) = 0x3ff00000;
  this_00[0x11].m_stageArray = (Biquad *)0x0;
  this_00[0x12].m_numStages = 0;
  this_00[0x12].m_maxStages = 0;
  this_00[0x12].m_stageArray = (Biquad *)0x0;
  this_00[0x13].m_numStages = 0;
  this_00[0x13].m_maxStages = 0;
  this_00[0x13].m_stageArray = (Biquad *)0x0;
  this_00[0x14].m_numStages = 0;
  this_00[0x14].m_maxStages = 0;
  this_00[0x14].m_stageArray = (Biquad *)0x0;
  this_00[0x15].m_numStages = 0;
  this_00[0x15].m_maxStages = 0;
  return 0;
}

Assistant:

int main(int, char**) {
    // setup & test 1st time
    std::cout << "Creating and testing filter using automatic decl\n";
    FilterType filter;
    filter.setupN(0.1);
    std::array<double, test_len> res1 { testFilter(filter) }; 
    // Test response: [0.192873, -0.427308, -0.00869136, 0.266734, 0.2204]

    // setup & test 2nd time
    std::cout << "Creating and testing filter using object assignment\n";
    filter = FilterType();  // this assignment seems to be the problem
    filter.setupN(0.1);
    std::array<double, test_len> res2 { testFilter(filter) }; 
    assert_print(sq_err(res1, res2) < 1e-10,
                 "Filter produces different results after initialisation by assignment.\n");
    
    // Copy into new filter and check same result from each.
    FilterType filter2 = filter;
    std::cout << "Calculating continued response using original filter:\n";
    res1 = testFilter(filter);
    std::cout << "Calculating continued response using assigned filter:\n";
    res2 = testFilter(filter2);
    assert_print(sq_err(res1, std::array<double, test_len> {
                          0.0189142, -0.150791, -0.197797, -0.129944, -0.00990682
                        }) < 1e-10,
                 "Incorrect result from original filter.\n");
    assert_print(sq_err(res1, res2) < 1e-10,
                 "Filter iterates inconsistently after copy.\n");
    
    std::cout << "Checking continued responses differ when second filter changes cutoff:\n";
    filter2.setupN(0.3);
    res1 = testFilter(filter);
    res2 = testFilter(filter2);
    assert_print(sq_err(res1, res2) > 1e-3,
                 "Altering assigned filter cutoff also changes original filter.\n");
    
    
    return 0;
}